

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O2

void __thiscall chrono::ChFile_ps_graph_setting::InitializeDefaults(ChFile_ps_graph_setting *this)

{
  ChFile_ps_axis_setting::InitializeDefaults(&this->Xaxis);
  ChFile_ps_axis_setting::InitializeDefaults(&this->Yaxis);
  ChFile_ps_axis_setting::SetLabel(&this->Xaxis,"t");
  ChFile_ps_axis_setting::SetLabel(&this->Yaxis,"Y");
  this->gridx = true;
  this->gridy = true;
  this->grid_width = 0.02;
  (this->grid_color).r = 0.5;
  (this->grid_color).g = 0.6;
  (this->grid_color).b = 0.9;
  SetTitle(this,"title");
  (this->title_color).b = 0.0;
  (this->title_color).r = 0.0;
  (this->title_color).g = 0.0;
  this->title_fontsize = 0.4;
  this->title_fontname = 0;
  this->picture_sizeX = 16.0;
  this->picture_sizeY = 6.0;
  (this->def_line_color).r = 0.7;
  (this->def_line_color).g = 0.0;
  (this->def_line_color).b = 0.0;
  this->def_line_width = 0.035;
  return;
}

Assistant:

void ChFile_ps_graph_setting::InitializeDefaults() {
    Xaxis.InitializeDefaults();
    Yaxis.InitializeDefaults();

    Xaxis.SetLabel((char*)"t");
    Yaxis.SetLabel((char*)"Y");

    gridx = true;
    gridy = true;
    grid_color.Set(0.5, 0.6, 0.9);
    grid_width = 0.02;

    SetTitle((char*)"title");
    title_color.SetGray(.0);
    title_fontsize = 0.4;
    title_fontname = 0;

    picture_sizeX = 16.0;
    picture_sizeY = 6.0;

    def_line_color.Set(0.7, 0, 0);
    def_line_width = 0.035;
}